

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwttests.c
# Opt level: O2

int main(void)

{
  uint N;
  int iVar1;
  wave_object obj;
  FILE *__stream;
  double *pdVar2;
  double *oup;
  double *array;
  long lVar3;
  wt_object wt;
  ulong uVar4;
  ulong uVar5;
  double local_25c8;
  double temp [1200];
  
  obj = wave_init("db4");
  wave_summary(obj);
  __stream = fopen("../data/signal.txt","r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot Open File");
    exit(100);
  }
  pdVar2 = &local_25c8;
  while (iVar1 = feof(__stream), iVar1 == 0) {
    __isoc99_fscanf(__stream,"%lf \n",pdVar2);
    pdVar2 = pdVar2 + 1;
  }
  fclose(__stream);
  pdVar2 = (double *)malloc(0x588);
  oup = (double *)malloc(0x588);
  array = (double *)malloc(0x588);
  for (lVar3 = 0; lVar3 != 0xb1; lVar3 = lVar3 + 1) {
    pdVar2[lVar3] = temp[lVar3 + -1];
  }
  wt = wt_init(obj,"modwt",0xb1,2);
  modwt(wt,pdVar2);
  for (lVar3 = 0; lVar3 < wt->outlength; lVar3 = lVar3 + 1) {
    printf("%g ",wt->output[lVar3]);
  }
  imodwt(wt,oup);
  N = wt->siglength;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)N) {
    uVar5 = (ulong)N;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    array[uVar4] = oup[uVar4] - pdVar2[uVar4];
  }
  absmax(array,N);
  printf("\n MAX %g \n");
  wt_summary(wt);
  wave_free(obj);
  wt_free(wt);
  free(pdVar2);
  free(oup);
  free(array);
  return 0;
}

Assistant:

int main() {
	wave_object obj;
	wt_object wt;
	double *inp, *out, *diff;
	int N, i, J;

	FILE *ifp;
	double temp[1200];

	char *name = "db4";
	obj = wave_init(name);
	wave_summary(obj);

	ifp = fopen("../data/signal.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = 177;
	
	fclose(ifp);

	inp = (double*)malloc(sizeof(double)* N);
	out = (double*)malloc(sizeof(double)* N);
	diff = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}
	J = 2;

	wt = wt_init(obj, "modwt", N, J);// Initialize the wavelet transform object
	
	modwt(wt, inp);// Perform MODWT
	//MODWT output can be accessed using wt->output vector. Use wt_summary to find out how to extract appx and detail coefficients
	
	for (i = 0; i < wt->outlength; ++i) {
		printf("%g ",wt->output[i]);
	}

	imodwt(wt, out);// Perform ISWT (if needed)
	// Test Reconstruction


	for (i = 0; i < wt->siglength; ++i) {
		diff[i] = out[i] - inp[i];
	}

	printf("\n MAX %g \n", absmax(diff, wt->siglength));// If Reconstruction succeeded then the output should be a small value.
	
	wt_summary(wt);// Prints the full summary.

	wave_free(obj);
	wt_free(wt);

	free(inp);
	free(out);
	free(diff);
	return 0;
}